

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<vkb::Device> * __thiscall
vkb::DeviceBuilder::build(Result<vkb::Device> *__return_storage_ptr__,DeviceBuilder *this)

{
  allocator<float> *this_00;
  VkBool32 *this_01;
  initializer_list<float> __l;
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  reference pCVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *pvVar5;
  reference __x;
  size_type sVar6;
  VulkanFunctions *pVVar7;
  vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_> *this_03;
  error_code error_code;
  error_code error_code_00;
  error_code local_a90;
  VkResult local_a7c;
  undefined1 auStack_a78 [4];
  VkResult res;
  Device device;
  VkBaseOutStructure **node;
  iterator __end1_4;
  iterator __begin1_4;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *__range1_4;
  VkBaseOutStructure **pnext_1;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *__range1_3;
  reference local_320;
  GenericFeaturesPNextNode *features_node;
  iterator __end3;
  iterator __begin3;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range3;
  undefined1 local_2f8 [8];
  VkPhysicalDeviceFeatures2 local_features2;
  GenericFeatureChain physical_device_extension_features_copy;
  error_code local_1e8;
  reference local_1d8;
  VkBaseOutStructure **pnext;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *__range1_2;
  undefined1 local_1b0 [7];
  bool user_defined_phys_dev_features_2;
  VkDeviceCreateInfo device_create_info;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> final_pnext_chain;
  value_type local_148;
  reference local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions_to_enable;
  VkDeviceQueueCreateInfo queue_create_info;
  CustomQueueDescription *desc;
  iterator __end1;
  iterator __begin1;
  vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_> *__range1;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> queueCreateInfos;
  vector<float,_std::allocator<float>_> local_88;
  uint local_6c;
  iterator iStack_68;
  uint32_t i;
  CustomQueueDescription *local_50;
  __normal_iterator<const_vkb::CustomQueueDescription_*,_std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>_>
  local_48;
  __normal_iterator<vkb::CustomQueueDescription_*,_std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>_>
  local_40;
  const_iterator local_38;
  undefined1 local_30 [8];
  vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
  queue_descriptions;
  DeviceBuilder *this_local;
  
  queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>::vector
            ((vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_> *)
             local_30);
  local_40._M_current =
       (CustomQueueDescription *)
       std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>::end
                 ((vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
                   *)local_30);
  __gnu_cxx::
  __normal_iterator<vkb::CustomQueueDescription_const*,std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>>
  ::__normal_iterator<vkb::CustomQueueDescription*>
            ((__normal_iterator<vkb::CustomQueueDescription_const*,std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>>
              *)&local_38,&local_40);
  this_03 = &(this->info).queue_descriptions;
  local_48._M_current =
       (CustomQueueDescription *)
       std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>::begin
                 (this_03);
  local_50 = (CustomQueueDescription *)
             std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
             ::end(this_03);
  iStack_68 = std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>::
              insert<__gnu_cxx::__normal_iterator<vkb::CustomQueueDescription_const*,std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>>,void>
                        ((vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>
                          *)local_30,local_38,local_48,
                         (__normal_iterator<const_vkb::CustomQueueDescription_*,_std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>_>
                          )local_50);
  bVar1 = std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>::
          empty((vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_> *
                )local_30);
  if (bVar1) {
    for (local_6c = 0; uVar3 = (ulong)local_6c,
        sVar6 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::size
                          (&(this->physical_device).queue_families), uVar3 < sVar6;
        local_6c = local_6c + 1) {
      queueCreateInfos.
      super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3f800000;
      this_00 = (allocator<float> *)
                ((long)&queueCreateInfos.
                        super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
      std::allocator<float>::allocator(this_00);
      __l._M_len = 1;
      __l._M_array = (iterator)
                     ((long)&queueCreateInfos.
                             super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      std::vector<float,_std::allocator<float>_>::vector(&local_88,__l,this_00);
      std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>::
      emplace_back<unsigned_int&,std::vector<float,std::allocator<float>>>
                ((vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>> *)
                 local_30,&local_6c,&local_88);
      std::vector<float,_std::allocator<float>_>::~vector(&local_88);
      std::allocator<float>::~allocator
                ((allocator<float> *)
                 ((long)&queueCreateInfos.
                         super__Vector_base<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    }
  }
  std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::vector
            ((vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> *)&__range1)
  ;
  __end1 = std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>::
           begin((vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
                  *)local_30);
  desc = (CustomQueueDescription *)
         std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>::end
                   ((vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
                     *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<vkb::CustomQueueDescription_*,_std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>_>
                                     *)&desc), bVar1) {
    pCVar4 = __gnu_cxx::
             __normal_iterator<vkb::CustomQueueDescription_*,_std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>_>
             ::operator*(&__end1);
    extensions_to_enable.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
    std::vector<float,_std::allocator<float>_>::size(&pCVar4->priorities);
    std::vector<float,_std::allocator<float>_>::data(&pCVar4->priorities);
    std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::push_back
              ((vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> *)
               &__range1,
               (value_type *)
               &extensions_to_enable.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<vkb::CustomQueueDescription_*,_std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>_>
    ::operator++(&__end1);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1_1);
  this_02 = &(this->physical_device).extensions_to_enable;
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_02);
  ext = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_02);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&ext), bVar1) {
    local_140 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    local_148 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1_1,&local_148);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  if (((this->physical_device).surface != (VkSurfaceKHR)0x0) ||
     (((this->physical_device).defer_surface_initialization & 1U) != 0)) {
    final_pnext_chain.
    super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_5572a;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1_1,
               (value_type *)
               &final_pnext_chain.
                super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::vector
            ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
             &device_create_info.pEnabledFeatures);
  memset(local_1b0,0,0x48);
  bVar1 = false;
  pvVar5 = &(this->info).pNext_chain;
  __end1_2 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::begin(pvVar5)
  ;
  pnext = (VkBaseOutStructure **)
          std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::end(pvVar5);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<VkBaseOutStructure_*const_*,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
                        *)&pnext);
    if (!bVar2) {
LAB_001304b2:
      if ((!bVar1) ||
         (bVar2 = std::
                  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                  ::empty(&(this->physical_device).extended_features_chain.nodes), bVar2)) {
        detail::GenericFeatureChain::GenericFeatureChain
                  ((GenericFeatureChain *)&local_features2.features.inheritedQueries,
                   &(this->physical_device).extended_features_chain);
        memset(local_2f8,0,0xf0);
        local_2f8._0_4_ = 0x3b9bb078;
        memcpy(&local_features2.pNext,&(this->physical_device).features,0xdc);
        if (!bVar1) {
          if (((this->physical_device).instance_version < 0x401000) &&
             (((this->physical_device).properties2_ext_enabled & 1U) == 0)) {
            device_create_info.ppEnabledExtensionNames = (char **)&(this->physical_device).features;
          }
          else {
            __range3 = (vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                        *)local_2f8;
            std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::push_back
                      ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                       &device_create_info.pEnabledFeatures,(value_type *)&__range3);
            this_01 = &local_features2.features.inheritedQueries;
            __end3 = std::
                     vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                     ::begin((vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                              *)this_01);
            features_node =
                 (GenericFeaturesPNextNode *)
                 std::
                 vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                 ::end((vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                        *)this_01);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
                                               *)&features_node), bVar1) {
              __range1_3 = (vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                           __gnu_cxx::
                           __normal_iterator<vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
                           ::operator*(&__end3);
              local_320 = (reference)__range1_3;
              std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::push_back
                        ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                         &device_create_info.pEnabledFeatures,(value_type *)&__range1_3);
              __gnu_cxx::
              __normal_iterator<vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
              ::operator++(&__end3);
            }
          }
        }
        pvVar5 = &(this->info).pNext_chain;
        __end1_3 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::begin
                             (pvVar5);
        pnext_1 = (VkBaseOutStructure **)
                  std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::end
                            (pvVar5);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1_3,
                                  (__normal_iterator<VkBaseOutStructure_*const_*,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
                                   *)&pnext_1), bVar1) {
          __x = __gnu_cxx::
                __normal_iterator<VkBaseOutStructure_*const_*,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
                ::operator*(&__end1_3);
          std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::push_back
                    ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                     &device_create_info.pEnabledFeatures,__x);
          __gnu_cxx::
          __normal_iterator<VkBaseOutStructure_*const_*,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
          ::operator++(&__end1_3);
        }
        detail::setup_pNext_chain<VkDeviceCreateInfo>
                  ((VkDeviceCreateInfo *)local_1b0,
                   (vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                   &device_create_info.pEnabledFeatures);
        __end1_4 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::begin
                             ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *
                              )&device_create_info.pEnabledFeatures);
        node = (VkBaseOutStructure **)
               std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::end
                         ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                          &device_create_info.pEnabledFeatures);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1_4,
                                  (__normal_iterator<VkBaseOutStructure_**,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
                                   *)&node), bVar1) {
          device.internal_table.fp_vkDestroyDevice =
               (PFN_vkDestroyDevice)
               __gnu_cxx::
               __normal_iterator<VkBaseOutStructure_**,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
               ::operator*(&__end1_4);
          if ((*(VkBaseOutStructure **)device.internal_table.fp_vkDestroyDevice)->sType ==
              VK_STRUCTURE_TYPE_APPLICATION_INFO) {
            __assert_fail("node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO",
                          "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                          ,0x6a4,"Result<Device> vkb::DeviceBuilder::build() const");
          }
          __gnu_cxx::
          __normal_iterator<VkBaseOutStructure_**,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
          ::operator++(&__end1_4);
        }
        local_1b0._0_4_ = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
        device_create_info.pNext._0_4_ = (this->info).flags;
        sVar6 = std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::size
                          ((vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
                            *)&__range1);
        device_create_info.pNext._4_4_ = (undefined4)sVar6;
        device_create_info._16_8_ =
             std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::data
                       ((vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> *
                        )&__range1);
        sVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1_1);
        device_create_info.ppEnabledLayerNames._0_4_ = (undefined4)sVar6;
        device_create_info._48_8_ =
             std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                       ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1_1);
        Device::Device((Device *)auStack_a78);
        pVVar7 = detail::vulkan_functions();
        local_a7c = (*pVVar7->fp_vkCreateDevice)
                              ((this->physical_device).physical_device,
                               (VkDeviceCreateInfo *)local_1b0,(this->info).allocation_callbacks,
                               (VkDevice *)auStack_a78);
        if (local_a7c == VK_SUCCESS) {
          PhysicalDevice::operator=((PhysicalDevice *)&device,&this->physical_device);
          device.physical_device._1720_8_ = (this->physical_device).surface;
          std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::operator=
                    ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)
                     &device.surface,&(this->physical_device).queue_families);
          device.queue_families.
          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(this->info).allocation_callbacks;
          pVVar7 = detail::vulkan_functions();
          device.allocation_callbacks = (VkAllocationCallbacks *)pVVar7->fp_vkGetDeviceProcAddr;
          pVVar7 = detail::vulkan_functions();
          detail::VulkanFunctions::
          get_device_proc_addr<void(*)(VkDevice_T*,unsigned_int,unsigned_int,VkQueue_T**)>
                    (pVVar7,_auStack_a78,
                     (_func_void_VkDevice_T_ptr_uint_uint_VkQueue_T_ptr_ptr **)
                     &device.instance_version,"vkGetDeviceQueue");
          pVVar7 = detail::vulkan_functions();
          detail::VulkanFunctions::
          get_device_proc_addr<void(*)(VkDevice_T*,VkAllocationCallbacks_const*)>
                    (pVVar7,_auStack_a78,
                     (_func_void_VkDevice_T_ptr_VkAllocationCallbacks_ptr **)&device.internal_table,
                     "vkDestroyDevice");
          device.fp_vkGetDeviceProcAddr._0_4_ = (this->physical_device).instance_version;
          Result<vkb::Device>::Result(__return_storage_ptr__,(Device *)auStack_a78);
        }
        else {
          std::error_code::error_code<vkb::DeviceError,void>(&local_a90,failed_create_device);
          error_code_00._4_4_ = 0;
          error_code_00._M_value = local_a90._M_value;
          error_code_00._M_cat = local_a90._M_cat;
          Result<vkb::Device>::Result(__return_storage_ptr__,error_code_00,local_a7c);
        }
        Device::~Device((Device *)auStack_a78);
        detail::GenericFeatureChain::~GenericFeatureChain
                  ((GenericFeatureChain *)&local_features2.features.inheritedQueries);
      }
      else {
        std::error_code::error_code<vkb::DeviceError,void>
                  (&local_1e8,
                   VkPhysicalDeviceFeatures2_in_pNext_chain_while_using_add_required_extension_features
                  );
        error_code._4_4_ = 0;
        error_code._M_value = local_1e8._M_value;
        error_code._M_cat = local_1e8._M_cat;
        Result<vkb::Device>::Result(__return_storage_ptr__,error_code,VK_SUCCESS);
      }
      std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::~vector
                ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                 &device_create_info.pEnabledFeatures);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1_1);
      std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::~vector
                ((vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> *)
                 &__range1);
      std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>::
      ~vector((vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_> *)
              local_30);
      return __return_storage_ptr__;
    }
    local_1d8 = __gnu_cxx::
                __normal_iterator<VkBaseOutStructure_*const_*,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
                ::operator*(&__end1_2);
    if ((*local_1d8)->sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2) {
      bVar1 = true;
      goto LAB_001304b2;
    }
    __gnu_cxx::
    __normal_iterator<VkBaseOutStructure_*const_*,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
    ::operator++(&__end1_2);
  } while( true );
}

Assistant:

Result<Device> DeviceBuilder::build() const {

    std::vector<CustomQueueDescription> queue_descriptions;
    queue_descriptions.insert(queue_descriptions.end(), info.queue_descriptions.begin(), info.queue_descriptions.end());

    if (queue_descriptions.empty()) {
        for (uint32_t i = 0; i < physical_device.queue_families.size(); i++) {
            queue_descriptions.emplace_back(i, std::vector<float>{ 1.0f });
        }
    }

    std::vector<VkDeviceQueueCreateInfo> queueCreateInfos;
    for (auto& desc : queue_descriptions) {
        VkDeviceQueueCreateInfo queue_create_info = {};
        queue_create_info.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
        queue_create_info.queueFamilyIndex = desc.index;
        queue_create_info.queueCount = static_cast<std::uint32_t>(desc.priorities.size());
        queue_create_info.pQueuePriorities = desc.priorities.data();
        queueCreateInfos.push_back(queue_create_info);
    }

    std::vector<const char*> extensions_to_enable;
    for (const auto& ext : physical_device.extensions_to_enable) {
        extensions_to_enable.push_back(ext.c_str());
    }
    if (physical_device.surface != VK_NULL_HANDLE || physical_device.defer_surface_initialization)
        extensions_to_enable.push_back({ VK_KHR_SWAPCHAIN_EXTENSION_NAME });

    std::vector<VkBaseOutStructure*> final_pnext_chain;
    VkDeviceCreateInfo device_create_info = {};

    bool user_defined_phys_dev_features_2 = false;
    for (auto& pnext : info.pNext_chain) {
        if (pnext->sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2) {
            user_defined_phys_dev_features_2 = true;
            break;
        }
    }

    if (user_defined_phys_dev_features_2 && !physical_device.extended_features_chain.nodes.empty()) {
        return { DeviceError::VkPhysicalDeviceFeatures2_in_pNext_chain_while_using_add_required_extension_features };
    }

    // These objects must be alive during the call to vkCreateDevice
    auto physical_device_extension_features_copy = physical_device.extended_features_chain;
    VkPhysicalDeviceFeatures2 local_features2{};
    local_features2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
    local_features2.features = physical_device.features;

    if (!user_defined_phys_dev_features_2) {
        if (physical_device.instance_version >= VKB_VK_API_VERSION_1_1 || physical_device.properties2_ext_enabled) {
            final_pnext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&local_features2));
            for (auto& features_node : physical_device_extension_features_copy.nodes) {
                final_pnext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&features_node));
            }
        } else {
            // Only set device_create_info.pEnabledFeatures when the pNext chain does not contain a VkPhysicalDeviceFeatures2 structure
            device_create_info.pEnabledFeatures = &physical_device.features;
        }
    }

    for (auto& pnext : info.pNext_chain) {
        final_pnext_chain.push_back(pnext);
    }

    detail::setup_pNext_chain(device_create_info, final_pnext_chain);
#if !defined(NDEBUG)
    for (auto& node : final_pnext_chain) {
        assert(node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO);
    }
#endif
    device_create_info.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
    device_create_info.flags = info.flags;
    device_create_info.queueCreateInfoCount = static_cast<uint32_t>(queueCreateInfos.size());
    device_create_info.pQueueCreateInfos = queueCreateInfos.data();
    device_create_info.enabledExtensionCount = static_cast<uint32_t>(extensions_to_enable.size());
    device_create_info.ppEnabledExtensionNames = extensions_to_enable.data();

    Device device;

    VkResult res = detail::vulkan_functions().fp_vkCreateDevice(
        physical_device.physical_device, &device_create_info, info.allocation_callbacks, &device.device);
    if (res != VK_SUCCESS) {
        return { DeviceError::failed_create_device, res };
    }

    device.physical_device = physical_device;
    device.surface = physical_device.surface;
    device.queue_families = physical_device.queue_families;
    device.allocation_callbacks = info.allocation_callbacks;
    device.fp_vkGetDeviceProcAddr = detail::vulkan_functions().fp_vkGetDeviceProcAddr;
    detail::vulkan_functions().get_device_proc_addr(device.device, device.internal_table.fp_vkGetDeviceQueue, "vkGetDeviceQueue");
    detail::vulkan_functions().get_device_proc_addr(device.device, device.internal_table.fp_vkDestroyDevice, "vkDestroyDevice");
    device.instance_version = physical_device.instance_version;
    return device;
}